

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

IterationConfig * __thiscall
deqp::gles31::Functional::anon_unknown_1::PointRenderCase::generateConfig
          (IterationConfig *__return_storage_ptr__,PointRenderCase *this,int iteration,
          IVec2 *renderTargetSize)

{
  float fVar1;
  float fVar2;
  Vector<float,_4> local_70;
  Vector<float,_4> local_60;
  Vector<float,_4> local_50;
  Vector<float,_4> local_40;
  Vector<float,_2> local_30;
  Vec2 patternScale;
  IVec2 *renderTargetSize_local;
  int iteration_local;
  PointRenderCase *this_local;
  IterationConfig *config;
  
  patternScale.m_data = (float  [2])renderTargetSize;
  BBoxRenderCase::generateRandomConfig
            (__return_storage_ptr__,&this->super_BBoxRenderCase,iteration * 0xdedede,
             renderTargetSize);
  if (((this->super_BBoxRenderCase).m_bboxSize == BBOXSIZE_EQUAL) ||
     ((this->super_BBoxRenderCase).m_bboxSize == BBOXSIZE_LARGER)) {
    tcu::Vector<float,_2>::Vector(&local_30,&__return_storage_ptr__->patternSize);
    if (((this->super_BBoxRenderCase).m_hasTessellationStage & 1U) != 0) {
      fVar1 = tcu::Vector<float,_2>::x(&local_30);
      fVar2 = tcu::Vector<float,_2>::y(&local_30);
      tcu::Vector<float,_4>::Vector(&local_40,fVar1 * 0.07,fVar2 * 0.07,0.0,0.0);
      tcu::Vector<float,_4>::operator-=(&(__return_storage_ptr__->bbox).min,&local_40);
      fVar1 = tcu::Vector<float,_2>::x(&local_30);
      fVar2 = tcu::Vector<float,_2>::y(&local_30);
      tcu::Vector<float,_4>::Vector(&local_50,fVar1 * 0.07,fVar2 * 0.07,0.0,0.0);
      tcu::Vector<float,_4>::operator+=(&(__return_storage_ptr__->bbox).max,&local_50);
    }
    if (((this->super_BBoxRenderCase).m_hasGeometryStage & 1U) != 0) {
      fVar1 = tcu::Vector<float,_2>::x(&local_30);
      fVar2 = tcu::Vector<float,_2>::y(&local_30);
      tcu::Vector<float,_4>::Vector(&local_60,fVar1 * 0.05,fVar2 * 0.02,0.0,0.0);
      tcu::Vector<float,_4>::operator-=(&(__return_storage_ptr__->bbox).min,&local_60);
      fVar1 = tcu::Vector<float,_2>::x(&local_30);
      fVar2 = tcu::Vector<float,_2>::y(&local_30);
      tcu::Vector<float,_4>::Vector(&local_70,fVar1 * 0.05,fVar2 * 0.03,0.0,0.0);
      tcu::Vector<float,_4>::operator+=(&(__return_storage_ptr__->bbox).max,&local_70);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

PointRenderCase::IterationConfig PointRenderCase::generateConfig (int iteration, const tcu::IVec2& renderTargetSize) const
{
	IterationConfig config = generateRandomConfig(0xDEDEDEu * (deUint32)iteration, renderTargetSize);

	// equal or larger -> expand according to shader expansion
	if (m_bboxSize == BBOXSIZE_EQUAL || m_bboxSize == BBOXSIZE_LARGER)
	{
		const tcu::Vec2 patternScale = config.patternSize;

		if (m_hasTessellationStage)
		{
			config.bbox.min -= tcu::Vec4(0.07f * patternScale.x(), 0.07f * patternScale.y(), 0.0f, 0.0f);
			config.bbox.max += tcu::Vec4(0.07f * patternScale.x(), 0.07f * patternScale.y(), 0.0f, 0.0f);
		}
		if (m_hasGeometryStage)
		{
			config.bbox.min -= tcu::Vec4(0.05f * patternScale.x(), 0.02f * patternScale.y(), 0.0f, 0.0f);
			config.bbox.max += tcu::Vec4(0.05f * patternScale.x(), 0.03f * patternScale.y(), 0.0f, 0.0f);
		}
	}

	return config;
}